

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O0

size_t __thiscall
cappuccino::utlru_cache<std::__cxx11::string,unsigned_long,(cappuccino::thread_safe)0>::
insert_range<std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>
          (utlru_cache<std::__cxx11::string,unsigned_long,(cappuccino::thread_safe)0> *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *key_value_range,allow a)

{
  bool bVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  expire_time_00;
  reference __in;
  type *key_00;
  type *value_00;
  type *value;
  type *key;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
  local_58;
  iterator __end0;
  iterator __begin0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range3;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> guard;
  size_t inserted;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  expire_time;
  time_point now;
  allow a_local;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *key_value_range_local;
  utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  expire_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  expire_time_00 =
       std::chrono::operator+(&expire_time,(duration<long,_std::ratio<1L,_1000L>_> *)(this + 0x28));
  guard._M_device = (mutex_type *)0x0;
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_>::lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> *)&__range3,
             (mutex_type *)this);
  __end0 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::begin(key_value_range);
  local_58._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::end(key_value_range);
  while (bVar1 = __gnu_cxx::operator!=(&__end0,&local_58), bVar1) {
    __in = __gnu_cxx::
           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
           ::operator*(&__end0);
    key_00 = std::get<0ul,std::__cxx11::string,unsigned_long>(__in);
    value_00 = std::get<1ul,std::__cxx11::string,unsigned_long>(__in);
    bVar1 = utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)0>
            ::do_insert_update((utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)0>
                                *)this,key_00,value_00,(time_point)expire_time.__d.__r,
                               (time_point)expire_time_00.__d.__r,a);
    if (bVar1) {
      guard._M_device =
           (mutex_type *)((long)&((guard._M_device)->m_lock).super___mutex_base._M_mutex + 1);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
    ::operator++(&__end0);
  }
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_>::~lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> *)&__range3);
  return (size_t)guard._M_device;
}

Assistant:

auto insert_range(range_type&& key_value_range, allow a = allow::insert_or_update) -> size_t
    {
        auto   now         = std::chrono::steady_clock::now();
        auto   expire_time = now + m_ttl;
        size_t inserted{0};

        {
            std::lock_guard guard{m_lock};
            for (auto& [key, value] : key_value_range)
            {
                if (do_insert_update(key, std::move(value), now, expire_time, a))
                {
                    ++inserted;
                }
            }
        }

        return inserted;
    }